

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  bool bVar1;
  StringPiece local_40;
  StringPiece local_30;
  
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(file + 8));
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,package_name);
  bVar1 = HasPrefixString(local_30,local_40);
  if (bVar1) {
    bVar1 = true;
    if ((*(long **)(file + 8))[1] != package_name->_M_string_length) {
      bVar1 = *(char *)(**(long **)(file + 8) + package_name->_M_string_length) == '.';
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const std::string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}